

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# package.cpp
# Opt level: O2

void __thiscall icu_63::Package::setItemCapacity(Package *this,int32_t max)

{
  Item *__src;
  Item *__dest;
  
  if (max <= this->itemMax) {
    return;
  }
  __dest = (Item *)uprv_malloc_63((long)max * 0x18);
  if (__dest != (Item *)0x0) {
    __src = this->items;
    if ((__src != (Item *)0x0) && (0 < (long)this->itemCount)) {
      memcpy(__dest,__src,(long)this->itemCount * 0x18);
    }
    this->itemMax = max;
    this->items = __dest;
    uprv_free_63(__src);
    return;
  }
  fprintf(_stderr,"icupkg: Out of memory trying to allocate %lu bytes for %d items\n",
          (long)max * 0x18,max);
  exit(7);
}

Assistant:

void Package::setItemCapacity(int32_t max)
{
  if(max<=itemMax) {
    return;
  }
  Item *newItems = (Item*)uprv_malloc(max * sizeof(items[0]));
  Item *oldItems = items;
  if(newItems == NULL) {
    fprintf(stderr, "icupkg: Out of memory trying to allocate %lu bytes for %d items\n",
        (unsigned long)(max*sizeof(items[0])), max);
    exit(U_MEMORY_ALLOCATION_ERROR);
  }
  if(items && itemCount>0) {
    uprv_memcpy(newItems, items, (size_t)itemCount*sizeof(items[0]));
  }
  itemMax = max;
  items = newItems;
  uprv_free(oldItems);
}